

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void opengv::relative_pose::modules::fivept_kneip::initMatrix
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix)

{
  Scalar *pSVar1;
  Index in_RDI;
  
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcb38);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcb57);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcb76);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcb95);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcbb4);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcbd3);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcbf2);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcc11);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcc30);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcc4f);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcc6e);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcc8d);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdccac);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcccb);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdccea);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcd09);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcd28);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcd47);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcd66);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcd85);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcda4);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcdc3);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcde2);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdce01);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdce20);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdce3f);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdce5e);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdce7d);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdce9c);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcebb);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdceda);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcef9);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcf18);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcf37);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcf56);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcf75);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcf94);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcfb3);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcfd2);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdcff1);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd010);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd02f);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd04e);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd06d);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd08c);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd0ab);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd0ca);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd0e9);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd108);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd127);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd146);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd165);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd184);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd1a3);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd1c2);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd1e1);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd200);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd21f);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd23e);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd25d);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd27c);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd29b);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd2ba);
  *pSVar1 = -1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd2d9);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)
                      groebnerMatrix,in_RDI,0xfdd2f8);
  *pSVar1 = -1.0;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::initMatrix(
    Eigen::Matrix<double,66,197> & groebnerMatrix)
{
  groebnerMatrix(10,169) = 1;
  groebnerMatrix(10,177) = 1;
  groebnerMatrix(10,186) = 1;
  groebnerMatrix(10,196) = -1;
  groebnerMatrix(11,166) = 1;
  groebnerMatrix(11,174) = 1;
  groebnerMatrix(11,183) = 1;
  groebnerMatrix(12,163) = 1;
  groebnerMatrix(12,171) = 1;
  groebnerMatrix(12,180) = 1;
  groebnerMatrix(13,151) = 1;
  groebnerMatrix(13,156) = 1;
  groebnerMatrix(13,162) = 1;
  groebnerMatrix(13,196) = -1;
  groebnerMatrix(14,148) = 1;
  groebnerMatrix(14,153) = 1;
  groebnerMatrix(14,159) = 1;
  groebnerMatrix(15,142) = 1;
  groebnerMatrix(15,144) = 1;
  groebnerMatrix(15,147) = 1;
  groebnerMatrix(15,196) = -1;
  groebnerMatrix(16,154) = -1;
  groebnerMatrix(16,158) = 1;
  groebnerMatrix(16,193) = -1;
  groebnerMatrix(17,172) = 1;
  groebnerMatrix(17,179) = -1;
  groebnerMatrix(17,190) = -1;
  groebnerMatrix(18,175) = -1;
  groebnerMatrix(18,182) = 1;
  groebnerMatrix(18,187) = -1;
  groebnerMatrix(19,149) = -1;
  groebnerMatrix(19,152) = 1;
  groebnerMatrix(19,195) = -1;
  groebnerMatrix(20,164) = 1;
  groebnerMatrix(20,170) = -1;
  groebnerMatrix(20,192) = -1;
  groebnerMatrix(21,167) = -1;
  groebnerMatrix(21,173) = 1;
  groebnerMatrix(21,189) = -1;
  groebnerMatrix(22,147) = 1;
  groebnerMatrix(22,162) = 1;
  groebnerMatrix(22,186) = 1;
  groebnerMatrix(22,196) = -1;
  groebnerMatrix(23,146) = 1;
  groebnerMatrix(23,161) = 1;
  groebnerMatrix(23,185) = 1;
  groebnerMatrix(24,145) = 1;
  groebnerMatrix(24,160) = 1;
  groebnerMatrix(24,184) = 1;
  groebnerMatrix(25,144) = 1;
  groebnerMatrix(25,156) = 1;
  groebnerMatrix(25,177) = 1;
  groebnerMatrix(25,196) = -1;
  groebnerMatrix(26,143) = 1;
  groebnerMatrix(26,155) = 1;
  groebnerMatrix(26,176) = 1;
  groebnerMatrix(27,168) = 1;
  groebnerMatrix(27,181) = -1;
  groebnerMatrix(27,188) = -1;
  groebnerMatrix(28,150) = 1;
  groebnerMatrix(28,157) = -1;
  groebnerMatrix(28,194) = -1;
  groebnerMatrix(29,165) = -1;
  groebnerMatrix(29,178) = 1;
  groebnerMatrix(29,191) = -1;
}